

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.y
# Opt level: O0

void __thiscall TypeDeclarator::~TypeDeclarator(TypeDeclarator *this)

{
  size_type sVar1;
  reference ppTVar2;
  uint local_14;
  uint4 i;
  TypeDeclarator *this_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<TypeModifier_*,_std::allocator<TypeModifier_*>_>::size(&this->mods);
    if (sVar1 <= local_14) break;
    ppTVar2 = std::vector<TypeModifier_*,_std::allocator<TypeModifier_*>_>::operator[]
                        (&this->mods,(ulong)local_14);
    if (*ppTVar2 != (value_type)0x0) {
      (*(*ppTVar2)->_vptr_TypeModifier[1])();
    }
    local_14 = local_14 + 1;
  }
  std::__cxx11::string::~string((string *)&this->model);
  std::__cxx11::string::~string((string *)&this->ident);
  std::vector<TypeModifier_*,_std::allocator<TypeModifier_*>_>::~vector(&this->mods);
  return;
}

Assistant:

TypeDeclarator::~TypeDeclarator(void)

{
  for(uint4 i=0;i<mods.size();++i)
    delete mods[i];
}